

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateLSTMWeightParams
                   (Result *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
                   LSTMParams *lstmParams)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  WeightParamType *wt;
  undefined1 *puVar7;
  pointer pWVar8;
  int iVar9;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *__range1;
  uint uVar10;
  int iVar11;
  WeightParamType WVar12;
  uint uVar13;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_58;
  string local_40;
  
  bVar1 = lstmParams->hasbiasvectors_;
  bVar2 = lstmParams->haspeepholevectors_;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  puVar7 = (undefined1 *)lstmWeightParams->inputgateweightmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  uVar10 = 4;
  if (uVar13 - uVar6 < 2) {
    uVar10 = 5;
    if (uVar13 != uVar6) {
      uVar10 = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (uVar10 = 2, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (uVar10 = 3, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      uVar10 = 5;
    }
  }
  local_40._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_58,(iterator)0x0,(WeightParamType *)&local_40);
  puVar7 = (undefined1 *)lstmWeightParams->forgetgateweightmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if ((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
       ((((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->blockinputweightmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->outputgateweightmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->inputgaterecursionmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->forgetgaterecursionmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->blockinputrecursionmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
        (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
        (local_40._M_dataplus._M_p._0_4_ = QINT,
        ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  puVar7 = (undefined1 *)lstmWeightParams->outputgaterecursionmatrix_;
  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
    puVar7 = Specification::_WeightParams_default_instance_;
  }
  iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar13 = (0 < iVar9) + 1;
  if (lVar3 == 0) {
    uVar13 = (uint)(0 < iVar9);
  }
  lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar13 = (uVar13 - (lVar4 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar13 - uVar6 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar13 != uVar6) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
    }
    if ((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
       ((((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QUINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
         (local_40._M_dataplus._M_p._0_4_ = QINT,
         ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar1 != false) {
    puVar7 = (undefined1 *)lstmWeightParams->inputgatebiasvector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    WVar12 = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      WVar12 = EMPTY;
      if (uVar13 != uVar6) {
        WVar12 = (uint)(iVar9 < 1);
      }
      if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
          (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (WVar12 = QUINT, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0))))
         && (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
             (WVar12 = QINT, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))
         ) {
        WVar12 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar12;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar12;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar7 = (undefined1 *)lstmWeightParams->forgetgatebiasvector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
      }
      if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
          (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar7 = (undefined1 *)lstmWeightParams->blockinputbiasvector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
      }
      if ((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
         ((((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)) &&
          (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar7 = (undefined1 *)lstmWeightParams->outputgatebiasvector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
      }
      if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
          (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (bVar2 != false) {
    puVar7 = (undefined1 *)lstmWeightParams->inputgatepeepholevector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    WVar12 = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      WVar12 = EMPTY;
      if (uVar13 != uVar6) {
        WVar12 = (uint)(iVar9 < 1);
      }
      if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
          (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (WVar12 = QUINT, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0))))
         && (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
             (WVar12 = QINT, ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))
         ) {
        WVar12 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar12;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar12;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar7 = (undefined1 *)lstmWeightParams->forgetgatepeepholevector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
      }
      if ((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
         ((((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)) &&
          (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    puVar7 = (undefined1 *)lstmWeightParams->outputgatepeepholevector_;
    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
      puVar7 = Specification::_WeightParams_default_instance_;
    }
    iVar9 = (((WeightParams *)puVar7)->floatvalue_).current_size_;
    lVar3 = *(long *)(((ulong)(((WeightParams *)puVar7)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar13 = (0 < iVar9) + 1;
    if (lVar3 == 0) {
      uVar13 = (uint)(0 < iVar9);
    }
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar7)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar7)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar6 = (uint)(lVar5 == 0);
    uVar13 = (uVar13 - (lVar4 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar13 - uVar6 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar13 != uVar6) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar9 < 1);
      }
      if (((((lVar3 == 0) && (uVar13 != uVar6)) && (iVar9 < 1)) &&
          (((lVar4 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) &&
         (((lVar5 == 0 || (puVar7 == Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          ((WeightParams *)puVar7)->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar9 = 0;
    iVar11 = 0;
    pWVar8 = local_58.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar8 == FLOAT16) {
        iVar11 = iVar11 + 1;
      }
      else if (*pWVar8 == FLOAT32) {
        iVar9 = iVar9 + 1;
      }
      if (0 < iVar9 * iVar11) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
                   ,"");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0035e5ff;
      }
      pWVar8 = pWVar8 + 1;
    } while (pWVar8 != local_58.
                       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  Result::Result(__return_storage_ptr__);
LAB_0035e5ff:
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();

    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}